

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void hide_ship(Am_Object *ship_obj)

{
  bool bVar1;
  Am_Value *this;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_Object local_20;
  byte local_11;
  Am_Object *pAStack_10;
  bool new_vis;
  Am_Object *ship_obj_local;
  
  pAStack_10 = ship_obj;
  this = (Am_Value *)Am_Object::Get((ushort)ship_obj,0x69);
  bVar1 = Am_Value::operator_cast_to_bool(this);
  local_11 = !bVar1;
  Am_Object::Set((ushort)ship_obj,true,(ulong)local_11);
  Am_Object::Am_Object(&local_20,(Am_Object *)ship_obj);
  hide_tractor_beams(&local_20,(bool)(local_11 & 1));
  Am_Object::~Am_Object(&local_20);
  if ((local_11 & 1) == 0) {
    Am_Object::Am_Object(&local_40,(Am_Object *)ship_obj);
    Am_Object::Remove_Part((Am_Object *)&SP_Ship_Agg);
    Am_Object::~Am_Object(&local_40);
  }
  else {
    Am_Object::Am_Object(local_38,(Am_Object *)ship_obj);
    Am_Object::Add_Part((Am_Object *)&SP_Ship_Agg,SUB81(local_38,0),1);
    Am_Object::~Am_Object(local_38);
  }
  return;
}

Assistant:

void
hide_ship(Am_Object ship_obj)
{
  bool new_vis = !(bool)ship_obj.Get(Am_VISIBLE);

  ship_obj.Set(Am_VISIBLE, new_vis);
  hide_tractor_beams(ship_obj, new_vis);
  if (new_vis)
    SP_Ship_Agg.Add_Part(ship_obj);
  else
    SP_Ship_Agg.Remove_Part(ship_obj);
}